

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O2

int xmlUTF8Charcmp(xmlChar *utf1,xmlChar *utf2)

{
  int iVar1;
  
  if (utf1 != (xmlChar *)0x0) {
    iVar1 = xmlUTF8Size(utf1);
    iVar1 = xmlStrncmp(utf1,utf2,iVar1);
    return iVar1;
  }
  return -(uint)(utf2 != (xmlChar *)0x0);
}

Assistant:

int
xmlUTF8Charcmp(const xmlChar *utf1, const xmlChar *utf2) {

    if (utf1 == NULL ) {
        if (utf2 == NULL)
            return 0;
        return -1;
    }
    return xmlStrncmp(utf1, utf2, xmlUTF8Size(utf1));
}